

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_arith64(ASMState *as,IRIns *ir,IRCallID id)

{
  ulong local_20;
  
  local_20 = (ulong)(CONCAT24((short)((ir->field_1).op12 >> 0x10),(ir->field_1).op12) &
                    0xffff0000ffff);
  asm_setupresult(as,ir,lj_ir_callinfo + id);
  asm_gencall(as,lj_ir_callinfo + id,(IRRef *)&local_20);
  return;
}

Assistant:

static void asm_arith64(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}